

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

void as197(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean
          ,double *var,double *resid,double *loglik,double *hess)

{
  double dVar1;
  uint uVar2;
  double *oup;
  alik_object __ptr;
  double *xi;
  double *xf;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 local_98 [8];
  custom_function as197_min;
  
  pvVar10 = (void *)(ulong)(uint)N;
  oup = (double *)malloc((long)(N - d) << 3);
  __ptr = alik_init(p,d,q,N);
  css(inp,N,optmethod,p,d,q,phi,theta,wmean,var,resid,loglik,hess);
  if (d < 1) {
    uVar7 = 0;
    uVar3 = 0;
    if (0 < N) {
      uVar3 = (ulong)(uint)N;
    }
    for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      oup[uVar7] = inp[uVar7];
    }
  }
  else {
    uVar2 = diff(inp,N,d,oup);
    pvVar10 = (void *)(ulong)uVar2;
  }
  iVar9 = (int)pvVar10;
  __ptr->N = iVar9;
  dVar1 = *wmean;
  __ptr->mean = dVar1;
  uVar2 = __ptr->pq;
  xi = (double *)malloc((long)(int)uVar2 << 3);
  xf = (double *)malloc((long)(int)uVar2 << 3);
  uVar3 = 0;
  uVar7 = 0;
  if (0 < p) {
    uVar7 = (ulong)(uint)p;
  }
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    xi[uVar3] = phi[uVar3];
  }
  uVar4 = 0;
  uVar3 = 0;
  if (0 < q) {
    uVar3 = (ulong)(uint)q;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    xi[(long)p + uVar4] = -theta[uVar4];
  }
  if (__ptr->M == 1) {
    xi[q + p] = dVar1;
  }
  pvVar5 = (void *)0x0;
  pvVar8 = (void *)0x0;
  if (0 < iVar9) {
    pvVar8 = pvVar10;
  }
  for (; pvVar8 != pvVar5; pvVar5 = (void *)((long)pvVar5 + 1)) {
    dVar1 = oup[(long)pvVar5];
    __ptr->x[(long)(iVar9 * 2) + (long)pvVar5] = dVar1;
    __ptr->x[(long)pvVar5] = dVar1;
  }
  for (lVar6 = (long)iVar9; lVar6 < iVar9 * 2; lVar6 = lVar6 + 1) {
    __ptr->x[lVar6] = 0.0;
  }
  local_98 = (undefined1  [8])fas197;
  uVar11 = 0;
  as197_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  as197_min.params = pvVar10;
  fminunc((custom_function *)local_98,(custom_gradient *)0x0,uVar2,xi,1.0,optmethod,xf);
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  for (; uVar4 != uVar11; uVar11 = uVar11 + 1) {
    printf("%g ",SUB84(xf[uVar11],0));
  }
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    phi[uVar4] = xf[uVar4];
  }
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    theta[uVar7] = xf[(long)p + uVar7];
  }
  uVar12 = 0;
  uVar13 = 0;
  if (__ptr->M == 1) {
    uVar12 = SUB84(xf[q + p],0);
    uVar13 = (undefined4)((ulong)xf[q + p] >> 0x20);
  }
  *wmean = (double)CONCAT44(uVar13,uVar12);
  uVar2 = (int)as197_min.params - d;
  uVar3 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar3;
  }
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    resid[uVar3] = __ptr->x[(long)iVar9 + uVar3];
  }
  *var = __ptr->ssq / (double)(int)as197_min.params;
  free(xi);
  free(xf);
  free(oup);
  free(__ptr);
  return;
}

Assistant:

void as197(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean, double *var,double *resid,double *loglik,double *hess) {
	int i, pq, retval, length;
	double *b, *tf, *x;
	double maxstep;
	alik_object obj;
	//custom_function as154_min;

	x = (double*)malloc(sizeof(double)* (N - d));

	length = N;

	maxstep = 1.0;

	obj = alik_init(p, d, q, N);


	css(inp, N, optmethod, p, d, q, phi, theta, wmean, var,resid,loglik,hess);

	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
	}

	obj->N = N;
	obj->mean = *wmean;
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}

	if (obj->M == 1) {
		b[p + q] = obj->mean;
	}

	//mdisplay(b, 1, pq);

	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function as197_min = { fas197, obj };
	retval = fminunc(&as197_min, NULL, pq, b, maxstep, optmethod, tf);

	for (i = 0; i < pq; ++i) {
		printf("%g ", tf[i]);
	}

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	for (i = 0; i < N - d; ++i) {
		resid[i] = obj->x[N + i];
	}
	*var = (obj->ssq) / (double)N;


	free(b);
	free(tf);
	free(x);
	free_alik(obj);
}